

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

re_status_t __thiscall
CRegexParser::compile
          (CRegexParser *this,char *expr_str,size_t exprlen,re_compiled_pattern_base *pat)

{
  long lVar1;
  size_t sVar2;
  utf8_ptr uVar3;
  re_state_id rVar4;
  re_machine rVar5;
  byte bVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  utf8_ptr uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  byte *pbVar18;
  re_recog_type rVar19;
  uint uVar20;
  CRegexParser *pCVar21;
  byte *pbVar22;
  re_machine *machine;
  utf8_ptr this_00;
  int var_id;
  int iVar23;
  re_machine new_machine;
  re_machine cur_machine;
  re_machine alter_machine;
  re_machine new_machine_1;
  anon_struct_36_7_ed371931 group_stack [20];
  utf8_ptr local_348;
  byte *local_340;
  re_machine local_338;
  re_machine local_330;
  re_machine local_328;
  re_compiled_pattern_base *local_320;
  re_machine local_318;
  int local_30c;
  re_machine local_308 [2];
  int local_2f8;
  undefined8 local_2f4;
  uint auStack_2ec [175];
  
  iVar23 = 0;
  local_348.p_ = (char *)0x0;
  reset(this);
  pat->group_cnt = 0;
  pat->loop_var_cnt = 0;
  local_340 = (byte *)0x0;
  if (0 < (long)exprlen) {
    local_340 = (byte *)0x0;
    pbVar18 = (byte *)expr_str;
    do {
      pbVar18 = pbVar18 + (ulong)(((*pbVar18 >> 5 & 1) != 0) + 1 & (uint)(*pbVar18 >> 7) * 3) + 1;
      local_340 = local_340 + 1;
    } while (pbVar18 < expr_str + exprlen);
  }
  pat->field_0x14 = pat->field_0x14 & 0xf0 | 0xd;
  local_330.init = -1;
  local_330.final = -1;
  local_328.init = -1;
  local_328.final = -1;
  local_348.p_ = expr_str;
  local_320 = pat;
LAB_00280cb9:
  pbVar18 = local_340;
  uVar13.p_ = local_348.p_;
  if (local_340 == (byte *)0x0) goto LAB_002817a6;
  wVar7 = utf8_ptr::s_getch(local_348.p_);
  iVar12 = iVar23;
  if (L';' < wVar7) {
    if (wVar7 < L'^') {
      if (wVar7 != L'<') {
        if (wVar7 == L'[') {
          this->range_buf_cnt_ = 0;
          iVar12 = 0;
          pCVar21 = (CRegexParser *)
                    (uVar13.p_ +
                    (ulong)((((byte)*uVar13.p_ >> 5 & 1) != 0) + 1 &
                           (uint)((byte)*uVar13.p_ >> 7) * 3) + 1);
          local_340 = pbVar18 + -1;
          local_348.p_ = (char *)pCVar21;
          if ((local_340 != (byte *)0x0) &&
             (wVar7 = utf8_ptr::s_getch((char *)pCVar21), wVar7 == L'^')) {
            bVar6 = (byte)pCVar21->next_state_;
            local_348.p_ = (char *)((long)&pCVar21->next_state_ +
                                   (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1
                                   );
            local_340 = pbVar18 + -2;
            iVar12 = 1;
          }
          pbVar18 = local_340;
          uVar13.p_ = local_348.p_;
          local_30c = iVar12;
          if ((local_340 != (byte *)0x0) && (wVar7 = utf8_ptr::s_getch(local_348.p_), wVar7 == L']')
             ) {
            ensure_range_buf_space(this);
            sVar2 = this->range_buf_cnt_;
            this->range_buf_cnt_ = sVar2 + 1;
            this->range_buf_[sVar2] = L']';
            sVar2 = this->range_buf_cnt_;
            this->range_buf_cnt_ = sVar2 + 1;
            this->range_buf_[sVar2] = L']';
            bVar6 = *uVar13.p_;
            local_348.p_ = uVar13.p_ +
                           (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1;
            local_340 = pbVar18 + -1;
          }
          pbVar18 = local_340;
          uVar3.p_ = local_348.p_;
          uVar13.p_ = local_348.p_;
          pbVar22 = local_340;
          if ((local_340 != (byte *)0x0) &&
             (wVar7 = utf8_ptr::s_getch(local_348.p_), uVar13.p_ = local_348.p_, pbVar22 = local_340
             , wVar7 == L'-')) {
            ensure_range_buf_space(this);
            sVar2 = this->range_buf_cnt_;
            this->range_buf_cnt_ = sVar2 + 1;
            this->range_buf_[sVar2] = L'-';
            sVar2 = this->range_buf_cnt_;
            this->range_buf_cnt_ = sVar2 + 1;
            this->range_buf_[sVar2] = L'-';
            bVar6 = *uVar3.p_;
            uVar13.p_ = uVar3.p_ + (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1
            ;
            local_340 = pbVar18 + -1;
            local_348.p_ = uVar13.p_;
            pbVar22 = local_340;
          }
          while ((pbVar18 = pbVar22, pbVar18 != (byte *)0x0 &&
                 (wVar7 = utf8_ptr::s_getch(uVar13.p_), wVar7 != L']'))) {
            wVar7 = utf8_ptr::s_getch(uVar13.p_);
            bVar6 = (byte)((CRegexParser *)uVar13.p_)->next_state_;
            uVar13.p_ = (char *)((long)&((CRegexParser *)uVar13.p_)->next_state_ +
                                (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1);
            if ((pbVar18 + -1 == (byte *)0x0) ||
               (wVar8 = utf8_ptr::s_getch(uVar13.p_), wVar8 != L'-')) {
              add_range_char(this,wVar7,wVar7);
              pbVar22 = pbVar18 + -1;
            }
            else {
              bVar6 = (byte)((CRegexParser *)uVar13.p_)->next_state_;
              uVar13.p_ = (char *)((long)&((CRegexParser *)uVar13.p_)->next_state_ +
                                  (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1)
              ;
              pbVar22 = pbVar18 + -2;
              if (pbVar18 + -2 != (byte *)0x0) {
                wVar9 = utf8_ptr::s_getch(uVar13.p_);
                bVar6 = (byte)((CRegexParser *)uVar13.p_)->next_state_;
                uVar13.p_ = (char *)((long)&((CRegexParser *)uVar13.p_)->next_state_ +
                                    (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) +
                                    1);
                wVar8 = wVar9;
                if (wVar7 < wVar9) {
                  wVar8 = wVar7;
                }
                if (wVar7 <= wVar9) {
                  wVar7 = wVar9;
                }
                add_range_char(this,wVar8,wVar7);
                pbVar22 = pbVar18 + -3;
              }
            }
          }
          local_348.p_ = uVar13.p_;
          local_340 = pbVar18;
          build_char_range(this,&local_338,local_30c);
          goto LAB_0028189a;
        }
        goto switchD_00280cf7_caseD_26;
      }
      if (((pbVar18 < (byte *)0x4) || (iVar11 = memicmp(uVar13.p_,"<FE>",4), iVar11 != 0)) &&
         ((pbVar18 < (byte *)0xa || (iVar11 = memicmp(uVar13.p_,"<FirstEnd>",10), iVar11 != 0)))) {
        if (((pbVar18 < (byte *)0x4) || (iVar11 = memicmp(uVar13.p_,"<FB>",4), iVar11 != 0)) &&
           ((pbVar18 < (byte *)0xc || (iVar11 = memicmp(uVar13.p_,"<FirstBegin>",0xc), iVar11 != 0))
           )) {
          if (pbVar18 < (byte *)0x5) {
LAB_00281295:
            if ((pbVar18 < (byte *)0x6) || (iVar11 = memicmp(uVar13.p_,"<Case>",6), iVar11 != 0)) {
              if ((pbVar18 < (byte *)0x8) || (iVar11 = memicmp(uVar13.p_,"<NoCase>",8), iVar11 != 0)
                 ) {
                iVar12 = compile_char_class_expr(this,&local_348,(size_t *)&local_340,&local_338);
                if (iVar12 != 0) goto LAB_0028189a;
switchD_00280cf7_caseD_26:
                wVar7 = utf8_ptr::s_getch(local_348.p_);
                build_char(this,&local_338,wVar7);
                goto LAB_0028189a;
              }
              bVar6 = local_320->field_0x14 & 0xfc | 2;
            }
            else {
              bVar6 = local_320->field_0x14 | 3;
            }
          }
          else {
            iVar11 = memicmp(uVar13.p_,"<Max>",5);
            if (iVar11 == 0) {
              bVar6 = local_320->field_0x14 | 4;
            }
            else {
              if ((pbVar18 < (byte *)0x5) || (iVar11 = memicmp(uVar13.p_,"<Min>",5), iVar11 != 0))
              goto LAB_00281295;
              bVar6 = local_320->field_0x14 & 0xfb;
            }
          }
        }
        else {
          bVar6 = local_320->field_0x14 | 8;
        }
      }
      else {
        bVar6 = local_320->field_0x14 & 0xf7;
      }
      local_320->field_0x14 = bVar6;
      uVar13.p_ = local_348.p_;
      pbVar18 = local_340;
      rVar5 = local_330;
      if (local_340 != (byte *)0x0) {
        do {
          wVar7 = utf8_ptr::s_getch(uVar13.p_);
          rVar5 = local_330;
          if (wVar7 == L'>') goto LAB_00281c1f;
          bVar6 = (byte)((CRegexParser *)uVar13.p_)->next_state_;
          uVar13.p_ = (char *)((long)&((CRegexParser *)uVar13.p_)->next_state_ +
                              (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1);
          pbVar18 = pbVar18 + -1;
        } while (pbVar18 != (byte *)0x0);
        pbVar18 = (byte *)0x0;
      }
    }
    else if (wVar7 == L'|') {
      alternate_onto(this,&local_328,&local_330);
      local_330.init = -1;
      local_330.final = -1;
      uVar13.p_ = local_348.p_;
      pbVar18 = local_340;
      rVar5 = local_330;
    }
    else {
      if ((wVar7 != L'^') || (local_330.init != -1)) goto switchD_00280cf7_caseD_26;
      build_special(this,&local_338,RE_TEXT_BEGIN,L'\0');
LAB_00281395:
      local_330 = local_338;
      uVar13.p_ = local_348.p_;
      pbVar18 = local_340;
      rVar5 = local_330;
    }
    goto LAB_00281c1f;
  }
  switch(wVar7) {
  case L'$':
    if (((pbVar18 != (byte *)0x1) && (wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1), wVar7 != L')')) &&
       (wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1), wVar7 != L'|')) goto switchD_00280cf7_caseD_26;
    build_special(this,&local_338,RE_TEXT_END,L'\0');
    if (local_330.init == -1) goto LAB_00281395;
    build_concat(this,&local_318,&local_330,&local_338);
    local_330 = local_318;
    uVar13.p_ = local_348.p_;
    pbVar18 = local_340;
    rVar5 = local_330;
    goto LAB_00281c1f;
  case L'%':
    uVar14 = (ulong)((((byte)*uVar13.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*uVar13.p_ >> 7) * 3);
    pCVar21 = (CRegexParser *)(uVar13.p_ + uVar14 + 1);
    local_340 = pbVar18 + -1;
    if (local_340 == (byte *)0x0) {
      pbVar22 = (byte *)(uVar13.p_ + uVar14);
      bVar6 = pbVar22[-(ulong)(~(uint)(*pbVar22 >> 6) & (uint)(*pbVar22 >> 7))];
      uVar13.p_ = (char *)(pbVar22 + -(ulong)(~(uint)(*pbVar22 >> 6) & (uint)(*pbVar22 >> 7)) +
                          -(ulong)(~(uint)(bVar6 >> 6) & (uint)(bVar6 >> 7)));
      rVar5 = local_330;
      goto LAB_00281c1f;
    }
    local_348.p_ = (char *)pCVar21;
    wVar7 = utf8_ptr::s_getch((char *)pCVar21);
    if (L'a' < wVar7) {
      if (L'r' < wVar7) {
        if (wVar7 == L's') {
          rVar19 = RE_SPACE;
        }
        else if (wVar7 == L'v') {
          rVar19 = RE_VSPACE;
        }
        else {
          if (wVar7 != L'w') goto switchD_0028117f_caseD_3a;
          rVar19 = RE_WORD_CHAR;
        }
        goto LAB_00281573;
      }
      if (wVar7 != L'b') {
        if (wVar7 != L'd') goto switchD_0028117f_caseD_3a;
        rVar19 = RE_DIGIT;
        goto LAB_00281573;
      }
      rVar19 = RE_WORD_BOUNDARY;
      goto LAB_0028153d;
    }
    break;
  default:
    goto switchD_00280cf7_caseD_26;
  case L'(':
    if (iVar23 < 0x15) {
      lVar16 = (long)iVar23;
      lVar1 = lVar16 * 0x24;
      *(re_machine *)((long)local_308 + lVar1) = local_330;
      *(re_machine *)((long)local_308 + lVar1 + 8) = local_328;
      (&local_2f8)[lVar16 * 9] = local_320->group_cnt;
      if ((pbVar18 < (byte *)0x3) || (wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1), wVar7 != L'?')) {
LAB_00281453:
        *(undefined8 *)((long)&local_2f4 + lVar1) = 1;
        (auStack_2ec + lVar16 * 9)[0] = 0;
        (auStack_2ec + lVar16 * 9)[1] = 0;
        local_320->group_cnt = local_320->group_cnt + 1;
      }
      else {
        wVar7 = utf8_ptr::s_getch_at(uVar13.p_,2);
        if (wVar7 < L'<') {
          if (wVar7 == L'!') {
            uVar17 = 0;
            uVar14 = (ulong)((((byte)*uVar13.p_ >> 5 & 1) != 0) + 1 &
                            (uint)((byte)*uVar13.p_ >> 7) * 3);
            local_348.p_ = uVar13.p_ +
                           ((((byte)uVar13.p_[uVar14 + 1] >> 5 & 1) != 0) + 1 &
                           (uint)((byte)uVar13.p_[uVar14 + 1] >> 7) * 3) + uVar14 + 2;
            uVar20 = 1;
          }
          else {
            if (wVar7 != L':') goto LAB_00281453;
            uVar17 = 0;
            uVar14 = (ulong)((((byte)*uVar13.p_ >> 5 & 1) != 0) + 1 &
                            (uint)((byte)*uVar13.p_ >> 7) * 3);
            local_348.p_ = uVar13.p_ +
                           ((((byte)uVar13.p_[uVar14 + 1] >> 5 & 1) != 0) + 1 &
                           (uint)((byte)uVar13.p_[uVar14 + 1] >> 7) * 3) + uVar14 + 2;
            uVar20 = 0;
          }
LAB_002816c2:
          local_340 = pbVar18 + -2;
          uVar10 = 0;
        }
        else {
          if (wVar7 == L'=') {
            uVar20 = 0;
            uVar14 = (ulong)((((byte)*uVar13.p_ >> 5 & 1) != 0) + 1 &
                            (uint)((byte)*uVar13.p_ >> 7) * 3);
            local_348.p_ = uVar13.p_ +
                           ((((byte)uVar13.p_[uVar14 + 1] >> 5 & 1) != 0) + 1 &
                           (uint)((byte)uVar13.p_[uVar14 + 1] >> 7) * 3) + uVar14 + 2;
            uVar17 = 1;
            goto LAB_002816c2;
          }
          if (((wVar7 != L'<') || (pbVar18 == (byte *)0x3)) ||
             ((wVar7 = utf8_ptr::s_getch_at(uVar13.p_,3), wVar7 != L'=' &&
              (wVar7 = utf8_ptr::s_getch_at(uVar13.p_,3), wVar7 != L'!')))) goto LAB_00281453;
          wVar7 = utf8_ptr::s_getch_at(uVar13.p_,3);
          uVar20 = (uint)(wVar7 != L'=');
          uVar17 = (uint)(wVar7 == L'=');
          uVar14 = (ulong)((((byte)*uVar13.p_ >> 5 & 1) != 0) + 1 &
                          (uint)((byte)*uVar13.p_ >> 7) * 3);
          uVar15 = (ulong)((((byte)uVar13.p_[uVar14 + 1] >> 5 & 1) != 0) + 1 &
                          (uint)((byte)uVar13.p_[uVar14 + 1] >> 7) * 3);
          local_348.p_ = uVar13.p_ +
                         (ulong)((((byte)uVar13.p_[uVar15 + 2 + uVar14] >> 5 & 1) != 0) + 1 &
                                (uint)((byte)uVar13.p_[uVar15 + 2 + uVar14] >> 7) * 3) +
                         uVar15 + uVar14 + 3;
          local_340 = pbVar18 + -3;
          uVar10 = 1;
        }
        *(undefined4 *)((long)&local_2f4 + lVar1) = 0;
        auStack_2ec[lVar16 * 9] = uVar17;
        auStack_2ec[lVar16 * 9 + -1] = uVar20;
        auStack_2ec[lVar16 * 9 + 1] = uVar10;
      }
      iVar12 = iVar23 + 1;
      local_330.init = -1;
      local_330.final = -1;
      local_328.init = -1;
      local_328.final = -1;
    }
    uVar13.p_ = local_348.p_;
    pbVar18 = local_340;
    rVar5 = local_330;
    if (0x14 < iVar23) {
      return RE_STATUS_GROUP_NESTING_TOO_DEEP;
    }
    goto LAB_00281c1f;
  case L')':
    goto LAB_002817b2;
  case L'.':
    build_special(this,&local_338,RE_WILDCARD,L'\0');
    goto LAB_0028189a;
  }
  switch(wVar7) {
  case L'1':
  case L'2':
  case L'3':
  case L'4':
  case L'5':
  case L'6':
  case L'7':
  case L'8':
  case L'9':
    wVar7 = utf8_ptr::s_getch((char *)pCVar21);
    build_group_matcher(this,&local_338,wVar7 + L'\xffffffcf');
    goto LAB_0028189a;
  default:
switchD_0028117f_caseD_3a:
    wVar7 = utf8_ptr::s_getch((char *)pCVar21);
    build_char(this,&local_338,wVar7);
    goto LAB_0028189a;
  case L'<':
    rVar19 = RE_WORD_BEGIN;
    goto LAB_0028153d;
  case L'>':
    rVar19 = RE_WORD_END;
    goto LAB_0028153d;
  case L'B':
    rVar19 = RE_NON_WORD_BOUNDARY;
LAB_0028153d:
    build_special(this,&local_338,rVar19,L'\0');
    concat_onto(this,&local_330,&local_338);
    uVar13.p_ = local_348.p_;
    pbVar18 = local_340;
    rVar5 = local_330;
LAB_00281c1f:
    iVar23 = iVar12;
    local_330 = rVar5;
    local_340 = pbVar18;
    local_348.p_ = uVar13.p_;
    if (local_340 == (byte *)0x0) {
LAB_002817a6:
      if (iVar23 == 0) {
        alternate_onto(this,&local_328,&local_330);
        rVar4 = local_328.init;
        iVar23 = break_loops(this,local_328.init,local_328.final,(regex_scan_frame *)0x0);
        if (iVar23 != 0) {
          local_328.final = rVar4;
        }
        machine = &local_328;
        remove_branch_to_branch(this,machine);
        consolidate_strings(this,machine);
        local_320->machine = local_328;
        local_320->tuple_cnt = this->next_state_;
        if (10 < local_320->group_cnt) {
          local_320->group_cnt = 10;
        }
        if (local_320->loop_var_cnt < 0x15) {
          return RE_STATUS_SUCCESS;
        }
        local_320->loop_var_cnt = 0x14;
        return RE_STATUS_SUCCESS;
      }
LAB_002817b2:
      uVar13.p_ = local_348.p_;
      pbVar18 = local_340;
      rVar5 = local_330;
      iVar12 = 0;
      if (iVar23 != 0) {
        iVar23 = iVar23 + -1;
        lVar16 = (long)iVar23;
        lVar1 = lVar16 * 0x24;
        uVar17 = auStack_2ec[lVar16 * 9 + 1];
        if (uVar17 != 0) {
          build_special(this,&local_338,RE_LOOKBACK_POS,L'\0');
          rVar5 = local_338;
          if (local_330.init != -1) {
            build_concat(this,&local_318,&local_330,&local_338);
            rVar5 = local_318;
          }
        }
        local_330 = rVar5;
        alternate_onto(this,&local_328,&local_330);
        if (*(int *)((long)&local_2f4 + lVar1) == 0) {
          if ((auStack_2ec[lVar16 * 9] == 0) && (auStack_2ec[lVar16 * 9 + -1] == 0)) {
            local_338 = local_328;
          }
          else {
            build_assert(this,&local_338,&local_328,auStack_2ec[lVar16 * 9 + -1],uVar17);
          }
        }
        else {
          build_group(this,&local_338,&local_328,(&local_2f8)[lVar16 * 9]);
        }
        local_330 = *(re_machine *)((long)local_308 + lVar1);
        local_328 = *(re_machine *)((long)local_308 + lVar1 + 8);
LAB_0028189a:
        pbVar22 = local_340;
        uVar13.p_ = local_348.p_;
        pbVar18 = local_340;
        if ((byte *)0x1 < local_340) {
          wVar7 = utf8_ptr::s_getch_at(local_348.p_,1);
          if ((uint)(wVar7 + L'\xffffffd6') < 2) {
LAB_002818d2:
            uVar17 = 0;
            local_348.p_ = local_348.p_ +
                           (ulong)((((byte)*local_348.p_ >> 5 & 1) != 0) + 1 &
                                  (uint)((byte)*local_348.p_ >> 7) * 3) + 1;
            local_340 = pbVar22 + -1;
            if ((byte *)0x1 < local_340) {
              wVar7 = utf8_ptr::s_getch_at(local_348.p_,1);
              uVar17 = (uint)(wVar7 == L'?');
            }
            wVar7 = utf8_ptr::s_getch(local_348.p_);
            build_closure(this,&local_318,&local_338,wVar7,uVar17);
            uVar13.p_ = local_348.p_;
            pbVar18 = local_340;
            local_338 = local_318;
          }
          else {
            if (wVar7 != L'{') {
              uVar13.p_ = local_348.p_;
              pbVar18 = local_340;
              if (wVar7 != L'?') goto LAB_00281bf2;
              goto LAB_002818d2;
            }
            if (local_320->loop_var_cnt <= iVar23) {
              local_320->loop_var_cnt = iVar23 + 1;
            }
            uVar14 = (ulong)((((byte)*local_348.p_ >> 5 & 1) != 0) + 1 &
                            (uint)((byte)*local_348.p_ >> 7) * 3);
            local_348.p_ = local_348.p_ +
                           ((((byte)local_348.p_[uVar14 + 1] >> 5 & 1) != 0) + 1 &
                           (uint)((byte)local_348.p_[uVar14 + 1] >> 7) * 3) + uVar14 + 2;
            local_340 = pbVar22 + -2;
            iVar11 = parse_int((CRegexParser *)uVar13.p_,&local_348,(size_t *)&local_340);
            pbVar22 = local_340;
            uVar3.p_ = local_348.p_;
            iVar12 = iVar11;
            uVar13.p_ = local_348.p_;
            pbVar18 = local_340;
            if ((local_340 != (byte *)0x0) &&
               (this_00.p_ = local_348.p_, wVar7 = utf8_ptr::s_getch(local_348.p_),
               uVar13.p_ = local_348.p_, pbVar18 = local_340, wVar7 == L',')) {
              bVar6 = *uVar3.p_;
              local_348.p_ = uVar3.p_ +
                             (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1;
              local_340 = pbVar22 + -1;
              iVar12 = parse_int((CRegexParser *)this_00.p_,&local_348,(size_t *)&local_340);
              uVar13.p_ = local_348.p_;
              pbVar18 = local_340;
            }
            while ((local_30c = iVar12, pbVar18 != (byte *)0x0 &&
                   (wVar7 = utf8_ptr::s_getch(uVar13.p_), wVar7 != L'}'))) {
              bVar6 = (byte)((CRegexParser *)uVar13.p_)->next_state_;
              pCVar21 = (CRegexParser *)
                        ((long)&((CRegexParser *)uVar13.p_)->next_state_ +
                        (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1);
              pbVar18 = (byte *)((long)uVar13.p_ + ((long)pbVar18 - (long)pCVar21));
              iVar12 = local_30c;
              uVar13.p_ = (char *)pCVar21;
            }
            iVar12 = 0;
            local_348.p_ = uVar13.p_;
            local_340 = pbVar18;
            if (((byte *)0x1 < pbVar18) &&
               (wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1), wVar7 == L'?')) {
              bVar6 = (byte)((CRegexParser *)uVar13.p_)->next_state_;
              local_348.p_ = (char *)((long)&((CRegexParser *)uVar13.p_)->next_state_ +
                                     (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) +
                                     1);
              local_340 = pbVar18 + -1;
              iVar12 = 1;
            }
            build_interval(this,&local_318,&local_338,iVar11,local_30c,iVar23,iVar12);
            uVar13.p_ = local_348.p_;
            pbVar18 = local_340;
            local_338 = local_318;
          }
          while ((byte *)0x1 < pbVar18) {
            wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1);
            if (((wVar7 == L'?') || (wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1), wVar7 == L'+')) ||
               (wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1), wVar7 == L'*')) {
              bVar6 = (byte)((CRegexParser *)uVar13.p_)->next_state_;
              uVar13.p_ = (char *)((long)&((CRegexParser *)uVar13.p_)->next_state_ +
                                  (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) + 1)
              ;
              pbVar18 = pbVar18 + -1;
            }
            else {
              wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1);
              pbVar22 = pbVar18;
              if (wVar7 != L'{') break;
              while (((byte *)0x1 < pbVar22 &&
                     (wVar7 = utf8_ptr::s_getch_at(uVar13.p_,1), pbVar18 = pbVar22, wVar7 != L'}')))
              {
                bVar6 = (byte)((CRegexParser *)uVar13.p_)->next_state_;
                uVar13.p_ = (char *)((long)&((CRegexParser *)uVar13.p_)->next_state_ +
                                    (ulong)(((bVar6 >> 5 & 1) != 0) + 1 & (uint)(bVar6 >> 7) * 3) +
                                    1);
                pbVar18 = (byte *)0x1;
                pbVar22 = pbVar22 + -1;
              }
            }
          }
        }
LAB_00281bf2:
        local_340 = pbVar18;
        local_348.p_ = uVar13.p_;
        uVar13.p_ = local_348.p_;
        pbVar18 = local_340;
        rVar5 = local_338;
        iVar12 = iVar23;
        if (local_330.init != -1) {
          build_concat(this,&local_318,&local_330,&local_338);
          uVar13.p_ = local_348.p_;
          pbVar18 = local_340;
          rVar5 = local_318;
        }
      }
      goto LAB_00281c1f;
    }
    local_348.p_ = local_348.p_ +
                   (ulong)((((byte)*local_348.p_ >> 5 & 1) != 0) + 1 &
                          (uint)((byte)*local_348.p_ >> 7) * 3) + 1;
    local_340 = local_340 + -1;
    goto LAB_00280cb9;
  case L'D':
    rVar19 = RE_NON_DIGIT;
    break;
  case L'S':
    rVar19 = RE_NON_SPACE;
    break;
  case L'V':
    rVar19 = RE_NON_VSPACE;
    break;
  case L'W':
    rVar19 = RE_NON_WORD_CHAR;
  }
LAB_00281573:
  build_special(this,&local_338,rVar19,L'\0');
  goto LAB_0028189a;
}

Assistant:

re_status_t CRegexParser::compile(const char *expr_str, size_t exprlen,
                                  re_compiled_pattern_base *pat)
{
    re_machine cur_machine;
    re_machine alter_machine;
    re_machine new_machine;
    int group_stack_level;
    struct
    {
        re_machine old_cur;
        re_machine old_alter;
        int group_id;
        int capturing;
        int neg_assertion;
        int pos_assertion;
        int back_assertion;
    } group_stack[RE_GROUP_NESTING_MAX];
    utf8_ptr expr;

    /* reset everything */
    reset();

    /* we have no groups yet */
    pat->group_cnt = 0;

    /* we have no looping variables yet */
    pat->loop_var_cnt = 0;

    /* get the length of the expression in characters */
    size_t exprchars = utf8_ptr::s_len(expr_str, exprlen);

    /* 
     *   set the default match modes - maximum, first-beginning,
     *   case-sensitive 
     */
    pat->longest_match = TRUE;
    pat->first_begin = TRUE;
    pat->case_sensitive = TRUE;
    pat->case_sensitivity_specified = FALSE;

    /* start out with no current machine and no alternate machine */
    build_null_machine(&cur_machine);
    build_null_machine(&alter_machine);

    /* nothing on the stack yet */
    group_stack_level = 0;

    /* loop until we run out of expression to parse */
    for (expr.set((char *)expr_str) ; exprchars != 0 ; expr.inc(), --exprchars)
    {
        switch(expr.getch())
        {
        case '^':
            /*
             *   beginning of line - if we're not at the beginning of the
             *   current expression (i.e., we already have some
             *   concatentations accumulated), treat it as an ordinary
             *   character 
             */
            if (!is_machine_null(&cur_machine))
                goto normal_char;

            /* build a new start-of-text recognizer */
            build_special(&new_machine, RE_TEXT_BEGIN, 0);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            concat_onto(&cur_machine, &new_machine);
            break;

        case '$':
            /*
             *   End of line specifier - if there's anything left after
             *   the '$' other than a close parens or alternation
             *   specifier, treat it as a normal character 
             */
            if (exprchars > 1
                && (expr.getch_at(1) != ')' && expr.getch_at(1) != '|'))
                goto normal_char;

            /* build a new end-of-text recognizer */
            build_special(&new_machine, RE_TEXT_END, 0);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            concat_onto(&cur_machine, &new_machine);
            break;
            
        case '(':
            {
                int capturing;
                int pos_assertion;
                int neg_assertion;
                int back_assertion;

                /* presume it's a capturing group */
                capturing = TRUE;

                /* presume it's not an assertion */
                pos_assertion = FALSE;
                neg_assertion = FALSE;
                back_assertion = FALSE;
                
                /* 
                 *   Add a nesting level.  Push the current machine and
                 *   alternate machines onto the group stack, and clear
                 *   everything out for the new group.  
                 */
                if (group_stack_level > RE_GROUP_NESTING_MAX)
                {
                    /* we cannot proceed - return an error */
                    return RE_STATUS_GROUP_NESTING_TOO_DEEP;
                }
                
                /* save the current state on the stack */
                group_stack[group_stack_level].old_cur = cur_machine;
                group_stack[group_stack_level].old_alter = alter_machine;
                
                /* 
                 *   Assign the group a group ID - groups are numbered in
                 *   order of their opening (left) parentheses, so we want
                 *   to assign a group number now.  We won't actually need
                 *   to know the group number until we get to the matching
                 *   close paren, but we need to assign it now, so store
                 *   it in the group stack.  
                 */
                group_stack[group_stack_level].group_id = pat->group_cnt;
                
                /* check for special group flags */
                if (exprchars > 2 && expr.getch_at(1) == '?')
                {
                    switch(expr.getch_at(2))
                    {
                    case '<':
                        /* look-back assertion */
                        if (exprchars > 3
                            && (expr.getch_at(3) == '='
                                || expr.getch_at(3) == '!'))
                        {
                            /* it's a look-back assertion */
                            back_assertion = TRUE;

                            /* assertions don't capture */
                            capturing = FALSE;

                            /* note whether it's positive or negative */
                            if (expr.getch_at(3) == '=')
                                pos_assertion = TRUE;
                            else
                                neg_assertion = TRUE;

                            /* skip the '?<=' or '?<!' part */
                            expr.inc();
                            expr.inc();
                            expr.inc();
                            exprchars -= 3;
                        }
                        break;
                        
                    case ':':
                        /* it's a non-capturing group */
                        capturing = FALSE;

                        /* skip two extra characters for the '?:' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    case '=':
                        /* it's a positive assertion group */
                        pos_assertion = TRUE;

                        /* assertions don't capture */
                        capturing = FALSE;

                        /* skip two extra characters for the '?=' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    case '!':
                        /* it's a negative assertion group */
                        neg_assertion = TRUE;

                        /* assertions don't capture */
                        capturing = FALSE;

                        /* skip two extra characters for the '?!' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    default:
                        /* it's not a recognized sequence - ignore it */
                        break;
                    }
                }

                /* remember if the group is capturing */
                group_stack[group_stack_level].capturing = capturing;

                /* remember if it's an assertion of some kind */
                group_stack[group_stack_level].pos_assertion = pos_assertion;
                group_stack[group_stack_level].neg_assertion = neg_assertion;
                group_stack[group_stack_level].back_assertion = back_assertion;
                
                /* consume the group number if it's a capturing group */
                if (capturing)
                    ++(pat->group_cnt);
                
                /* push the level */
                ++group_stack_level;
                
                /* start the new group with empty machines */
                build_null_machine(&cur_machine);
                build_null_machine(&alter_machine);
            }
            break;

        case ')':
        do_close_paren:
            /* if there's nothing on the stack, ignore this */
            if (group_stack_level == 0)
                break;

            /* take a level off the stack */
            --group_stack_level;

            /* 
             *   For a lookback assertion, add the lookback parent position
             *   match assertion to the group.  This ensures that we can only
             *   match the group when the match leaves us at the same
             *   position where the lookback assertion was matched.  
             */
            if (group_stack[group_stack_level].back_assertion)
            {
                build_special(&new_machine, RE_LOOKBACK_POS, 0);
                concat_onto(&cur_machine, &new_machine);
            }

            /* 
             *   Remove a nesting level.  If we have a pending alternate
             *   expression, build the alternation expression.  This will
             *   leave the entire group expression in alter_machine,
             *   regardless of whether an alternation was in progress or
             *   not.  
             */
            alternate_onto(&alter_machine, &cur_machine);

            /*
             *   Create a group machine that encloses the group and marks
             *   it with a group number.  We assigned the group number
             *   when we parsed the open paren, so read that group number
             *   from the stack.
             *   
             *   Note that this will leave 'new_machine' with the entire
             *   group machine.
             *   
             *   If this is a non-capturing group, don't bother building
             *   the new machine - just copy the current alternation
             *   machine onto the new machine.  
             */
            if (group_stack[group_stack_level].capturing)
            {
                /* it's a regular capturing group - add the group machine */
                build_group(&new_machine, &alter_machine,
                            group_stack[group_stack_level].group_id);
            }
            else if (group_stack[group_stack_level].pos_assertion
                     || group_stack[group_stack_level].neg_assertion)
            {
                /* it's an assertion - build the assertion group */
                build_assert(&new_machine, &alter_machine,
                             group_stack[group_stack_level].neg_assertion,
                             group_stack[group_stack_level].back_assertion);
            }
            else
            {
                /* it's a non-capturing group - just add the group tree */
                new_machine = alter_machine;
            }

            /*
             *   Pop the stack - restore the alternation and current
             *   machines that were in progress before the group started. 
             */
            cur_machine = group_stack[group_stack_level].old_cur;
            alter_machine = group_stack[group_stack_level].old_alter;

            /*
             *   Check the group expression (in new_machine) for postfix
             *   expressions 
             */
            goto apply_postfix;

        case '|':
            /* 
             *   Start a new alternation.  This ends the current
             *   alternation; if we have a previous pending alternate,
             *   build an alternation machine out of the previous
             *   alternate and the current machine and move that to the
             *   alternate; otherwise, simply move the current machine to
             *   the pending alternate. 
             */
            alternate_onto(&alter_machine, &cur_machine);

            /* 
             *   the alternation starts out with a blank slate, so null
             *   out the current machine 
             */
            build_null_machine(&cur_machine);
            break;

        case '<':
            /* check for our various special directives */
            if ((exprchars >= 4 && memicmp(expr.getptr(), "<FE>", 4) == 0)
                || (exprchars >= 10
                    && memicmp(expr.getptr(), "<FirstEnd>", 10) == 0))
            {
                /* turn off first-begin mode */
                pat->first_begin = FALSE;
            }
            else if ((exprchars >= 4 && memicmp(expr.getptr(), "<FB>", 4) == 0)
                     || (exprchars >= 12
                         && memicmp(expr.getptr(), "<FirstBegin>", 12) == 0))
            {
                /* turn on first-begin mode */
                pat->first_begin = TRUE;
            }
            else if (exprchars >= 5 && memicmp(expr.getptr(), "<Max>", 5) == 0)
            {
                /* turn on longest-match mode */
                pat->longest_match = TRUE;
            }
            else if (exprchars >= 5 && memicmp(expr.getptr(), "<Min>", 5) == 0)
            {
                /* turn off longest-match mode */
                pat->longest_match = FALSE;
            }
            else if (exprchars >= 6
                     && memicmp(expr.getptr(), "<Case>", 6) == 0)
            {
                /* turn on case sensitivity */
                pat->case_sensitive = TRUE;
                pat->case_sensitivity_specified = TRUE;
            }
            else if (exprchars >= 8
                     && memicmp(expr.getptr(), "<NoCase>", 8) == 0)
            {
                /* turn off case sensitivity */
                pat->case_sensitive = FALSE;
                pat->case_sensitivity_specified = TRUE;
            }
            else
            {
                /*
                 *   It's nothing else we recognize, so it must be a
                 *   character class or class range expression, which
                 *   consists of one or more classes, single characters, or
                 *   character ranges separated by '|' delimiters.  
                 */
                if (compile_char_class_expr(&expr, &exprchars, &new_machine))
                {
                    /* success - look for postfix operators */
                    goto apply_postfix;
                }
                else
                {
                    /* 
                     *   failure - treat the whole thing as ordinary
                     *   characters 
                     */
                    goto normal_char;
                }
            }

            /* skip everything up to the closing ">" */
            while (exprchars > 0 && expr.getch() != '>')
                expr.inc(), --exprchars ;
            break;

        case '%':
            /* 
             *   quoted character - skip the quote mark and see what we
             *   have 
             */
            expr.inc();
            --exprchars;

            /* check to see if we're at the end of the expression */
            if (exprchars == 0)
            {
                /* 
                 *   end of the string - ignore it, but undo the extra
                 *   increment of the expression index so that we exit the
                 *   enclosing loop properly 
                 */
                expr.dec();
                ++exprchars;
                break;
            }

            /* see what we have */
            switch(expr.getch())
            {
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                /* group match - build a new literal group recognizer */
                build_group_matcher(&new_machine,
                                    value_of_digit(expr.getch()) - 1);

                /* apply any postfix expression to the group recognizer */
                goto apply_postfix;

            case '<':
                /* build a beginning-of-word recognizer */
                build_special(&new_machine, RE_WORD_BEGIN, 0);

                /* it can't be postfixed - just concatenate it */
                concat_onto(&cur_machine, &new_machine);
                break;

            case '>':
                /* build an end-of-word recognizer */
                build_special(&new_machine, RE_WORD_END, 0);

                /* it can't be postfixed - just concatenate it */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 'w':
                /* word character */
                build_special(&new_machine, RE_WORD_CHAR, 0);
                goto apply_postfix;

            case 'W':
                /* non-word character */
                build_special(&new_machine, RE_NON_WORD_CHAR, 0);
                goto apply_postfix;

            case 'b':
                /* word boundary */
                build_special(&new_machine, RE_WORD_BOUNDARY, 0);

                /* it can't be postfixed */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 'B':
                /* not a word boundary */
                build_special(&new_machine, RE_NON_WORD_BOUNDARY, 0);

                /* it can't be postfixed */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 's':
                /* %s -> same as <space> */
                build_special(&new_machine, RE_SPACE, 0);
                goto apply_postfix;

            case 'S':
                /* %S -> same as <^space> */
                build_special(&new_machine, RE_NON_SPACE, 0);
                goto apply_postfix;

            case 'd':
                /* %d -> same as <digit> */
                build_special(&new_machine, RE_DIGIT, 0);
                goto apply_postfix;

            case 'D':
                /* %D -> same as <^digit> */
                build_special(&new_machine, RE_NON_DIGIT, 0);
                goto apply_postfix;

            case 'v':
                /* %v -> same as <vspace> */
                build_special(&new_machine, RE_VSPACE, 0);
                goto apply_postfix;

            case 'V':
                /* %V -> same as <^vspace> */
                build_special(&new_machine, RE_NON_VSPACE, 0);
                goto apply_postfix;

            default:
                /* build a new literal character recognizer */
                build_char(&new_machine, expr.getch());

                /* apply any postfix expression to the character */
                goto apply_postfix;
            }
            break;

        case '.':
            /* 
             *   wildcard character - build a single character recognizer
             *   for the special wildcard symbol, then go check it for a
             *   postfix operator 
             */
            build_special(&new_machine, RE_WILDCARD, 0);
            goto apply_postfix;
            break;

        case '[':
            /* range expression */
            {
                int is_exclusive = FALSE;

                /* we have no entries yet */
                range_buf_cnt_ = 0;

                /* first, skip the open bracket */
                expr.inc();
                --exprchars;

                /* check to see if starts with the exclusion character */
                if (exprchars != 0 && expr.getch() == '^')
                {
                    /* skip the exclusion specifier */
                    expr.inc();
                    --exprchars;

                    /* note it */
                    is_exclusive = TRUE;
                }

                /* 
                 *   if the first character is a ']', include it in the
                 *   range 
                 */
                if (exprchars != 0 && expr.getch() == ']')
                {
                    add_range_char(']');
                    expr.inc();
                    --exprchars;
                }

                /*
                 *   if the next character is a '-', include it in the
                 *   range 
                 */
                if (exprchars != 0 && expr.getch() == '-')
                {
                    add_range_char('-');
                    expr.inc();
                    --exprchars;
                }

                /* scan the character set */
                while (exprchars != 0 && expr.getch() != ']')
                {
                    /* note this character */
                    wchar_t ch = expr.getch();

                    /* skip this character of the expression */
                    expr.inc();
                    --exprchars;

                    /* check for a range */
                    if (exprchars != 0 && expr.getch() == '-')
                    {
                        /* skip the '-' */
                        expr.inc();
                        --exprchars;
                        if (exprchars != 0)
                        {
                            /* get the other end of the range */
                            wchar_t ch2 = expr.getch();

                            /* skip the second character */
                            expr.inc();
                            --exprchars;

                            /* if the range is reversed, swap it */
                            if (ch > ch2)
                            {
                                wchar_t tmp = ch;
                                ch = ch2;
                                ch2 = tmp;
                            }

                            /* add the range */
                            add_range_char(ch, ch2);
                        }
                    }
                    else
                    {
                        /* no range - add the one-character range */
                        add_range_char(ch);
                    }
                }

                /* create a character range machine */
                build_char_range(&new_machine, is_exclusive);

                /* apply any postfix operator */
                goto apply_postfix;
            }            
            break;

        default:
        normal_char:
            /* 
             *   it's an ordinary character - build a single character
             *   recognizer machine, and then concatenate it onto any
             *   existing machine 
             */
            build_char(&new_machine, expr.getch());

        apply_postfix:
            /*
             *   Check for a postfix operator, and apply it to the machine
             *   in 'new_machine' if present.  In any case, concatenate
             *   the 'new_machine' (modified by a postix operator or not)
             *   to the current machien.  
             */
            if (exprchars > 1)
            {
                switch(expr.getch_at(1))
                {
                case '*':
                case '+':
                case '?':
                    /*
                     *   We have a postfix closure operator.  Build a new
                     *   closure machine out of 'new_machine'.  
                     */
                    {
                        /* move onto the closure operator */
                        expr.inc();
                        --exprchars;

                        /* 
                         *   if the next character is '?', it's a modifier
                         *   that indicates that we are to use the
                         *   shortest match - note it if so 
                         */
                        int shortest =
                            (exprchars > 1 && expr.getch_at(1) == '?');

                        /* build the closure machine */
                        re_machine closure_machine;
                        build_closure(&closure_machine,
                                      &new_machine, expr.getch(), shortest);
                        
                        /* replace the original machine with the closure */
                        new_machine = closure_machine;
                    }
                        
                    /* 
                     *   skip any redundant closure symbols, keeping only the
                     *   first one we saw 
                     */
                skip_closures:
                    while (exprchars > 1)
                    {
                        /* check for a simple closure suffix */
                        if (expr.getch_at(1) == '?'
                            || expr.getch_at(1) == '+'
                            || expr.getch_at(1) == '*')
                        {
                            /* skip it and keep looping */
                            expr.inc();
                            --exprchars;
                            continue;
                        }
                        
                        /* check for an interval */
                        if (expr.getch_at(1) == '{')
                        {
                            /* skip until we find the matching '}' */
                            while (exprchars > 1 && expr.getch_at(1) != '}')
                                expr.inc(), --exprchars;
                            
                            /* go back for anything that follows */
                            continue;
                        }
                        
                        /* if it's anything else, we're done discarding */
                        break;
                    }
                    break;

                case '{':
                    /* interval specifier */
                    {
                        int min_val;
                        int max_val;
                        re_machine interval_machine;
                        int shortest;
                        int var_id;

                        /* 
                         *   loops can never overlap, but can be nested;
                         *   so the only thing we have to worry about in
                         *   assigning a loop variable is the group
                         *   nesting depth 
                         */
                        var_id = group_stack_level;

                        /* note the highest variable ID we've seen */
                        if (var_id >= pat->loop_var_cnt)
                            pat->loop_var_cnt = var_id + 1;

                        /* presume neither min nor max will be specified */
                        min_val = -1;
                        max_val = -1;
                        
                        /* skip the current character and the '{' */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        
                        /* parse the minimum count, if provided */
                        min_val = parse_int(&expr, &exprchars);

                        /* if there's a comma, parse the maximum value */
                        if (exprchars >= 1 && expr.getch() == ',')
                        {
                            /* skip the ',' and parse the number */
                            expr.inc();
                            --exprchars;
                            max_val = parse_int(&expr, &exprchars);
                        }
                        else
                        {
                            /* 
                             *   there's no other value, so this is a
                             *   simple loop with the same value for min
                             *   and max 
                             */
                            max_val = min_val;
                        }

                        /* 
                         *   if we're not looking at a '}', skip
                         *   characters until we are 
                         */
                        while (exprchars != 0 && expr.getch() != '}')
                            expr.inc(&exprchars);

                        /* 
                         *   if there's a '?' following, it's a 'shortest'
                         *   modifier - note it 
                         */
                        shortest = FALSE;
                        if (exprchars > 1 && expr.getch_at(1) == '?')
                        {
                            /* note the modifier */
                            shortest = TRUE;

                            /* skip another character for the modifier */
                            expr.inc();
                            --exprchars;
                        }

                        /* set up an interval node */
                        build_interval(&interval_machine, &new_machine,
                                       min_val, max_val, var_id, shortest);

                        /* replace the original machine with the interval */
                        new_machine = interval_machine;

                        /* skip any closure modifiers that follow */
                        goto skip_closures;
                    }
                    break;
                    
                default:
                    /* no postfix operator */
                    break;
                }
            }

            /*
             *   Concatenate the new machine onto the current machine
             *   under construction.  
             */
            concat_onto(&cur_machine, &new_machine);
            break;
        }

        /* if we've run down the expression string, go no further */
        if (exprchars == 0)
            break;
    }

    /* if there are any open parens outstanding, close them */
    if (group_stack_level != 0)
        goto do_close_paren;

    /* complete any pending alternation */
    alternate_onto(&alter_machine, &cur_machine);

    /* check for and break any infinite loops */
    break_loops(&alter_machine);

    /* remove meaningless branch-to-branch transitions */
    remove_branch_to_branch(&alter_machine);

    /* consolidate consecutive character transitions into strings */
    consolidate_strings(&alter_machine);

    /* store the results in the caller's base pattern description */
    pat->machine = alter_machine;
    pat->tuple_cnt = next_state_;

    /* limit the group count to the maximum */
    if (pat->group_cnt > RE_GROUP_REG_CNT)
        pat->group_cnt = RE_GROUP_REG_CNT;

    /* limit the variable count to the maximum */
    if (pat->loop_var_cnt > RE_LOOP_VARS_MAX)
        pat->loop_var_cnt = RE_LOOP_VARS_MAX;

    /* no errors encountered */
    return RE_STATUS_SUCCESS;
}